

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::getSubroutineUniformName_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest2 *this,_shader_stage *stage)

{
  TestError *this_00;
  allocator<char> local_22;
  undefined1 local_21;
  _shader_stage *local_20;
  _shader_stage *stage_local;
  NegativeTest2 *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = stage;
  stage_local = (_shader_stage *)this;
  this_local = (NegativeTest2 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  switch(*local_20) {
  case SHADER_STAGE_FIRST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"test_vs_subroutine");
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"test_tc_subroutine");
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"test_te_subroutine");
    break;
  case SHADER_STAGE_GEOMETRY:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"test_gs_subroutine");
    break;
  case SHADER_STAGE_FRAGMENT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"test_fs_subroutine");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader stage requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2c1a);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest2::getSubroutineUniformName(const Utils::_shader_stage& stage) const
{
	std::string result = "?";

	switch (stage)
	{
	case Utils::SHADER_STAGE_FRAGMENT:
	{
		result = "test_fs_subroutine";

		break;
	}

	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result = "test_gs_subroutine";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result = "test_tc_subroutine";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result = "test_te_subroutine";

		break;
	}

	case Utils::SHADER_STAGE_VERTEX:
	{
		result = "test_vs_subroutine";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized shader stage requested");
	}
	} /* switch (stage) */

	return result;
}